

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O2

void leb__SplittingMatrix(float (*splittingMatrix) [3],uint32_t splitBit)

{
  float *pfVar1;
  float *pfVar2;
  int i;
  long lVar3;
  float *extraout_RDX;
  int i_1;
  float *pfVar4;
  long lVar5;
  int j_1;
  float fVar6;
  lebMatrix3x3 tra;
  lebMatrix3x3 tmp;
  float local_b8;
  float local_b4;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined4 local_a0;
  float local_9c;
  float local_98;
  float local_88 [12];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38;
  
  local_b4 = (float)(int)splitBit;
  local_b8 = 1.0 - local_b4;
  local_b0 = 0x3f00000000000000;
  uStack_a8 = 0x3f00000000000000;
  local_a0 = 0;
  pfVar1 = (float *)&local_58;
  local_38 = splittingMatrix[2][2];
  local_48 = *(undefined8 *)(splittingMatrix[1] + 1);
  uStack_40 = *(undefined8 *)splittingMatrix[2];
  local_58 = *(undefined8 *)*splittingMatrix;
  uStack_50 = *(undefined8 *)(*splittingMatrix + 2);
  pfVar2 = local_88;
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    pfVar4 = pfVar1;
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      pfVar2[lVar5] = *pfVar4;
      pfVar4 = pfVar4 + 3;
    }
    pfVar2 = pfVar2 + 3;
    pfVar1 = pfVar1 + 1;
  }
  pfVar1 = (float *)0x3;
  local_9c = local_b8;
  local_98 = local_b4;
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    pfVar2 = local_88;
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      fVar6 = leb__DotProduct((int)&local_b8 + (int)lVar3 * 0xc,pfVar2,pfVar1);
      (*splittingMatrix)[lVar5] = fVar6;
      pfVar2 = pfVar2 + 3;
      pfVar1 = extraout_RDX;
    }
    splittingMatrix = splittingMatrix + 1;
  }
  return;
}

Assistant:

static void
leb__SplittingMatrix(lebMatrix3x3 splittingMatrix, uint32_t splitBit)
{
    float b = float(splitBit);
    float c = 1.0f - b;
    lebMatrix3x3 splitMatrix = {
        {c   , b   , 0.0f},
        {0.5f, 0.0f, 0.5f},
        {0.0f,    c,    b}
    };
    lebMatrix3x3 tmp;

    memcpy(tmp, splittingMatrix, sizeof(tmp));
    leb__Matrix3x3Product(splitMatrix, tmp, splittingMatrix);
}